

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O0

void __thiscall cpprofiler::Connector::restart(Connector *this,int restart_id)

{
  ostream *poVar1;
  int in_ESI;
  stringstream ss;
  string info;
  string *in_stack_fffffffffffffdd8;
  string *this_00;
  Connector *in_stack_fffffffffffffe10;
  stringstream local_1d0 [16];
  ostream local_1c0 [399];
  allocator local_31;
  string local_30 [36];
  int local_c;
  
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::stringstream::stringstream(local_1d0);
  std::operator<<(local_1c0,"{");
  poVar1 = std::operator<<(local_1c0,"\"restart_id\": ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::operator<<(poVar1,"\n");
  std::operator<<(local_1c0,"}");
  std::__cxx11::stringstream::str();
  this_00 = (string *)&stack0xfffffffffffffe10;
  std::__cxx11::string::operator=(local_30,this_00);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  MessageMarshalling::makeRestart((MessageMarshalling *)this_00,in_stack_fffffffffffffdd8);
  sendOverSocket(in_stack_fffffffffffffe10);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void restart(int restart_id = -1) {

    std::string info{""};
    {
      std::stringstream ss;
      ss << "{";
      ss << "\"restart_id\": " << restart_id << "\n";
      ss << "}";
      info = ss.str();
    }

    marshalling.makeRestart(info);
    sendOverSocket();
  }